

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O2

vector<serial_port,_std::allocator<serial_port>_> *
open_ports(vector<serial_port,_std::allocator<serial_port>_> *__return_storage_ptr__,
          vector<interface,_std::allocator<interface>_> *interfaces,io_context *queue)

{
  pointer piVar1;
  string *psVar2;
  runtime_error *this;
  pointer c;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  serial_port local_e0;
  
  (__return_storage_ptr__->super__Vector_base<serial_port,_std::allocator<serial_port>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<serial_port,_std::allocator<serial_port>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<serial_port,_std::allocator<serial_port>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = (interfaces->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
      super__Vector_impl_data._M_start;
  piVar1 = (interfaces->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (c == piVar1) {
      return __return_storage_ptr__;
    }
    serial_port::serial_port(&local_e0,c,queue);
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = boost::system::system_category();
    psVar2 = interface::device_abi_cxx11_(c);
    boost::asio::
    basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::open(&local_e0.port,(char *)psVar2,(int)&ec);
    if (ec.failed_ == true) break;
    local_160._M_dataplus._M_p._0_4_ = (type)interface::baud_rate(c);
    psVar2 = interface::device_abi_cxx11_(c);
    std::__cxx11::string::string((string *)&local_140,"baud_rate",(allocator *)&local_120);
    set_port_option<boost::asio::serial_port_base::baud_rate>
              (&local_e0,(baud_rate *)&local_160,psVar2,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    local_160._M_dataplus._M_p._0_4_ = interface::parity(c);
    psVar2 = interface::device_abi_cxx11_(c);
    std::__cxx11::string::string((string *)&local_140,"parity",(allocator *)&local_120);
    set_port_option<boost::asio::serial_port_base::parity>
              (&local_e0,(parity *)&local_160,psVar2,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    local_160._M_dataplus._M_p._0_4_ = (type)interface::stop_bits(c);
    psVar2 = interface::device_abi_cxx11_(c);
    std::__cxx11::string::string((string *)&local_140,"stop_bits",(allocator *)&local_120);
    set_port_option<boost::asio::serial_port_base::stop_bits>
              (&local_e0,(stop_bits *)&local_160,psVar2,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    local_160._M_dataplus._M_p._0_4_ = (type)interface::character_size(c);
    psVar2 = interface::device_abi_cxx11_(c);
    std::__cxx11::string::string((string *)&local_140,"character_size",(allocator *)&local_120);
    set_port_option<boost::asio::serial_port_base::character_size>
              (&local_e0,(character_size *)&local_160,psVar2,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::vector<serial_port,_std::allocator<serial_port>_>::emplace_back<serial_port>
              (__return_storage_ptr__,&local_e0);
    serial_port::~serial_port(&local_e0);
    c = c + 1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  psVar2 = interface::device_abi_cxx11_(c);
  std::operator+(&local_120,"error opening interface \"",psVar2);
  std::operator+(&local_160,&local_120,"\": ");
  (*(ec.cat_)->_vptr_error_category[4])(&local_100,ec.cat_,(ulong)(uint)ec.val_);
  std::operator+(&local_140,&local_160,&local_100);
  std::runtime_error::runtime_error(this,(string *)&local_140);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector< serial_port > open_ports(
    const std::vector< interface >& interfaces, boost::asio::io_context& queue )
{
    std::vector< serial_port > ports;

    std::transform( interfaces.begin(), interfaces.end(), back_inserter( ports ),
        [&queue]( const interface& config )
        {
            serial_port port( config, queue );

            boost::system::error_code ec;
            port.port.open( config.device(), ec );

            if ( ec )
                throw std::runtime_error( "error opening interface \"" + config.device() + "\": " + ec.message() );

            set_port_option( port, config.baud_rate(), config.device(), "baud_rate" );
            set_port_option( port, config.parity(), config.device(), "parity" );
            set_port_option( port, config.stop_bits(), config.device(), "stop_bits" );
            set_port_option( port, config.character_size(), config.device(), "character_size" );

            return port;
        }
    );

    return ports;
}